

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

bool __thiscall
wasm::SimplifyLocals<true,_false,_true>::runMainOptimizations
          (SimplifyLocals<true,_false,_true> *this,Function *func)

{
  Block *pBVar1;
  bool bVar2;
  size_type sVar3;
  reference ppBVar4;
  reference ppIVar5;
  ExpressionList *pEVar6;
  reference ppLVar7;
  Module *pMVar8;
  size_t sVar9;
  Expression **ppEVar10;
  Expression *pEVar11;
  string_view local_d8;
  Builder local_c8;
  Block *local_c0;
  Block *block_1;
  Loop *loop;
  iterator __end3_2;
  iterator __begin3_2;
  vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_> *__range3_2;
  Builder local_88;
  Block *local_80;
  Block *ifFalse;
  Builder local_68;
  Block *local_60;
  Block *ifTrue;
  If *iff;
  iterator __end3_1;
  iterator __begin3_1;
  vector<wasm::If_*,_std::allocator<wasm::If_*>_> *__range3_1;
  Block *block;
  iterator __end3;
  iterator __begin3;
  vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> *__range3;
  Function *func_local;
  SimplifyLocals<true,_false,_true> *this_local;
  
  this->anotherCycle = false;
  Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
  ::doWalkFunction((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                    *)&(this->
                       super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                       ).
                       super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                   ,func);
  sVar3 = std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::size(&this->blocksToEnlarge);
  if (sVar3 != 0) {
    __end3 = std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::begin
                       (&this->blocksToEnlarge);
    block = (Block *)std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::end
                               (&this->blocksToEnlarge);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wasm::Block_**,_std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>_>
                                       *)&block), bVar2) {
      ppBVar4 = __gnu_cxx::
                __normal_iterator<wasm::Block_**,_std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>_>
                ::operator*(&__end3);
      pBVar1 = *ppBVar4;
      pMVar8 = Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
               ::getModule((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                            *)&(this->
                               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                               ).
                               super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                          );
      pEVar11 = (Expression *)MixedArena::alloc<wasm::Nop>(&pMVar8->allocator);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(pBVar1->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar11
                );
      __gnu_cxx::
      __normal_iterator<wasm::Block_**,_std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>_>
      ::operator++(&__end3);
    }
    std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::clear(&this->blocksToEnlarge);
    this->anotherCycle = true;
  }
  sVar3 = std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::size(&this->ifsToEnlarge);
  if (sVar3 != 0) {
    __end3_1 = std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::begin(&this->ifsToEnlarge);
    iff = (If *)std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::end(&this->ifsToEnlarge);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<wasm::If_**,_std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>_>
                               *)&iff), bVar2) {
      ppIVar5 = __gnu_cxx::
                __normal_iterator<wasm::If_**,_std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>_>
                ::operator*(&__end3_1);
      ifTrue = (Block *)*ppIVar5;
      pMVar8 = Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
               ::getModule((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                            *)&(this->
                               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                               ).
                               super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                          );
      Builder::Builder(&local_68,pMVar8);
      pEVar11 = (Expression *)(ifTrue->name).super_IString.str._M_str;
      wasm::Name::Name((Name *)&ifFalse);
      local_60 = Builder::blockifyWithName(&local_68,pEVar11,(Name)_ifFalse,(Expression *)0x0);
      (ifTrue->name).super_IString.str._M_str = (char *)local_60;
      sVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(local_60->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
      if (sVar9 == 0) {
LAB_01b24831:
        pEVar6 = &local_60->list;
        pMVar8 = Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                 ::getModule((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                              *)&(this->
                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                                 ).
                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                            );
        pEVar11 = (Expression *)MixedArena::alloc<wasm::Nop>(&pMVar8->allocator);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar6->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   pEVar11);
      }
      else {
        ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                             (&(local_60->list).
                               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             );
        bVar2 = Expression::is<wasm::Nop>(*ppEVar10);
        if (!bVar2) goto LAB_01b24831;
      }
      if ((ifTrue->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          data != (Expression **)0x0) {
        pMVar8 = Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                 ::getModule((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                              *)&(this->
                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                                 ).
                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                            );
        Builder::Builder(&local_88,pMVar8);
        pEVar11 = (Expression *)
                  (ifTrue->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
        wasm::Name::Name((Name *)&__range3_2);
        local_80 = Builder::blockifyWithName(&local_88,pEVar11,(Name)___range3_2,(Expression *)0x0);
        (ifTrue->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
        data = (Expression **)local_80;
        sVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                          (&(local_80->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
        if (sVar9 != 0) {
          ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                               (&(local_80->list).
                                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               );
          bVar2 = Expression::is<wasm::Nop>(*ppEVar10);
          if (bVar2) goto LAB_01b24952;
        }
        pEVar6 = &local_80->list;
        pMVar8 = Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                 ::getModule((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                              *)&(this->
                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                                 ).
                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                            );
        pEVar11 = (Expression *)MixedArena::alloc<wasm::Nop>(&pMVar8->allocator);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar6->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   pEVar11);
      }
LAB_01b24952:
      __gnu_cxx::
      __normal_iterator<wasm::If_**,_std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>_>::
      operator++(&__end3_1);
    }
    std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::clear(&this->ifsToEnlarge);
    this->anotherCycle = true;
  }
  sVar3 = std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>::size(&this->loopsToEnlarge);
  if (sVar3 != 0) {
    __end3_2 = std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>::begin
                         (&this->loopsToEnlarge);
    loop = (Loop *)std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>::end
                             (&this->loopsToEnlarge);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_2,
                              (__normal_iterator<wasm::Loop_**,_std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>_>
                               *)&loop), bVar2) {
      ppLVar7 = __gnu_cxx::
                __normal_iterator<wasm::Loop_**,_std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>_>
                ::operator*(&__end3_2);
      block_1 = (Block *)*ppLVar7;
      pMVar8 = Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
               ::getModule((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                            *)&(this->
                               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                               ).
                               super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                          );
      Builder::Builder(&local_c8,pMVar8);
      pEVar11 = (Expression *)
                (block_1->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data;
      wasm::Name::Name((Name *)&local_d8);
      local_c0 = Builder::blockifyWithName(&local_c8,pEVar11,(Name)local_d8,(Expression *)0x0);
      (block_1->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)local_c0;
      sVar9 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                        (&(local_c0->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
      if (sVar9 == 0) {
LAB_01b24aba:
        pEVar6 = &local_c0->list;
        pMVar8 = Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                 ::getModule((Walker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                              *)&(this->
                                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
                                 ).
                                 super_LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>
                            );
        pEVar11 = (Expression *)MixedArena::alloc<wasm::Nop>(&pMVar8->allocator);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&pEVar6->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   pEVar11);
      }
      else {
        ppEVar10 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                             (&(local_c0->list).
                               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             );
        bVar2 = Expression::is<wasm::Nop>(*ppEVar10);
        if (!bVar2) goto LAB_01b24aba;
      }
      __gnu_cxx::
      __normal_iterator<wasm::Loop_**,_std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>_>::
      operator++(&__end3_2);
    }
    std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>::clear(&this->loopsToEnlarge);
    this->anotherCycle = true;
  }
  std::
  map<unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>_>
  ::clear(&this->sinkables);
  std::
  map<wasm::Name,_std::vector<wasm::SimplifyLocals<true,_false,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_false,_true>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_false,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_false,_true>::BlockBreak>_>_>_>_>
  ::clear(&this->blockBreaks);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::clear
            (&this->unoptimizableBlocks);
  return (bool)(this->anotherCycle & 1);
}

Assistant:

bool runMainOptimizations(Function* func) {
    anotherCycle = false;
    WalkerPass<LinearExecutionWalker<
      SimplifyLocals<allowTee, allowStructure, allowNesting>>>::
      doWalkFunction(func);
    // enlarge blocks that were marked, for the next round
    if (blocksToEnlarge.size() > 0) {
      for (auto* block : blocksToEnlarge) {
        block->list.push_back(
          this->getModule()->allocator.template alloc<Nop>());
      }
      blocksToEnlarge.clear();
      anotherCycle = true;
    }
    // enlarge ifs that were marked, for the next round
    if (ifsToEnlarge.size() > 0) {
      for (auto* iff : ifsToEnlarge) {
        auto ifTrue =
          Builder(*this->getModule()).blockifyWithName(iff->ifTrue, Name());
        iff->ifTrue = ifTrue;
        if (ifTrue->list.size() == 0 ||
            !ifTrue->list.back()->template is<Nop>()) {
          ifTrue->list.push_back(
            this->getModule()->allocator.template alloc<Nop>());
        }
        if (iff->ifFalse) {
          auto ifFalse =
            Builder(*this->getModule()).blockifyWithName(iff->ifFalse, Name());
          iff->ifFalse = ifFalse;
          if (ifFalse->list.size() == 0 ||
              !ifFalse->list.back()->template is<Nop>()) {
            ifFalse->list.push_back(
              this->getModule()->allocator.template alloc<Nop>());
          }
        }
      }
      ifsToEnlarge.clear();
      anotherCycle = true;
    }
    // enlarge loops that were marked, for the next round
    if (loopsToEnlarge.size() > 0) {
      for (auto* loop : loopsToEnlarge) {
        auto block =
          Builder(*this->getModule()).blockifyWithName(loop->body, Name());
        loop->body = block;
        if (block->list.size() == 0 ||
            !block->list.back()->template is<Nop>()) {
          block->list.push_back(
            this->getModule()->allocator.template alloc<Nop>());
        }
      }
      loopsToEnlarge.clear();
      anotherCycle = true;
    }
    // clean up
    sinkables.clear();
    blockBreaks.clear();
    unoptimizableBlocks.clear();
    return anotherCycle;
  }